

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::encode_query_param(string *value)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  _Setw _Var4;
  byte *pbVar5;
  undefined8 in_RSI;
  string *in_RDI;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  ostringstream escaped;
  ostream *in_stack_fffffffffffffe28;
  ostream *in_stack_fffffffffffffe30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  undefined8 local_1a0;
  long local_188 [47];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::ios::fill((char)local_188 + (char)*(undefined8 *)(local_188[0] + -0x18));
  std::ostream::operator<<(local_188,std::hex);
  local_1a0 = local_10;
  local_1a8._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffe30,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffe28);
    if (!bVar2) break;
    pbVar5 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_1a8);
    bVar1 = *pbVar5;
    iVar3 = isalnum((uint)bVar1);
    if ((((((iVar3 == 0) && (bVar1 != 0x2d)) && (bVar1 != 0x5f)) &&
         ((bVar1 != 0x2e && (bVar1 != 0x21)))) &&
        ((bVar1 != 0x7e && ((bVar1 != 0x2a && (bVar1 != 0x27)))))) &&
       ((bVar1 != 0x28 && (bVar1 != 0x29)))) {
      std::ostream::operator<<(local_188,std::uppercase);
      in_stack_fffffffffffffe30 = std::operator<<((ostream *)local_188,'%');
      _Var4 = std::setw(2);
      in_stack_fffffffffffffe28 = std::operator<<(in_stack_fffffffffffffe30,_Var4);
      std::ostream::operator<<(in_stack_fffffffffffffe28,(uint)bVar1);
      std::ostream::operator<<(local_188,std::nouppercase);
    }
    else {
      std::operator<<((ostream *)local_188,bVar1);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_1a8);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  return in_RDI;
}

Assistant:

inline std::string encode_query_param(const std::string& value) {
            std::ostringstream escaped;
            escaped.fill('0');
            escaped << std::hex;

            for (auto c : value) {
                if (std::isalnum(static_cast<uint8_t>(c)) || c == '-' || c == '_' ||
                    c == '.' || c == '!' || c == '~' || c == '*' || c == '\'' || c == '(' ||
                    c == ')') {
                    escaped << c;
                } else {
                    escaped << std::uppercase;
                    escaped << '%' << std::setw(2)
                        << static_cast<int>(static_cast<unsigned char>(c));
                    escaped << std::nouppercase;
                }
            }

            return escaped.str();
        }